

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_hosts_file.c
# Opt level: O2

ares_status_t ares_hosts_update(ares_channel_t *channel,ares_bool_t use_env)

{
  int iVar1;
  ares_bool_t aVar2;
  ares_status_t aVar3;
  char *pcVar4;
  time_t tVar5;
  ares_buf_t *buf;
  ares_hosts_file_t *paVar6;
  char *pcVar7;
  ares_htable_strvp_t *paVar8;
  size_t sVar9;
  ares_hosts_entry_t *entry;
  ares_llist_t *paVar10;
  ares_llist_node_t *paVar11;
  ares_hosts_entry_t *paVar12;
  ares_llist_node_t *node;
  void *pvVar13;
  size_t out_len;
  ares_status_t aVar14;
  bool bVar15;
  uchar local_15a [2];
  ares_hosts_entry_t *local_158;
  ares_hosts_file_t *local_150;
  ares_llist_node_t *local_148;
  size_t local_140;
  stat st;
  
  if (channel->hosts_path == (char *)0x0) {
    if (use_env != ARES_FALSE) goto LAB_00110fd4;
    pcVar4 = "/etc/hosts";
LAB_00110fec:
    pcVar4 = ares_strdup(pcVar4);
    if (pcVar4 == (char *)0x0) {
      return ARES_ENOMEM;
    }
  }
  else {
    pcVar4 = ares_strdup(channel->hosts_path);
    if (pcVar4 == (char *)0x0) {
      return ARES_ENOMEM;
    }
    if (use_env != ARES_FALSE) {
      ares_free(pcVar4);
LAB_00110fd4:
      pcVar4 = getenv("CARES_HOSTS");
      goto LAB_00110fec;
    }
  }
  paVar6 = channel->hf;
  iVar1 = stat(pcVar4,(stat *)&st);
  if (paVar6 != (ares_hosts_file_t *)0x0) {
    if (st.st_mtim.tv_sec == 0 || iVar1 != 0) {
      tVar5 = time((time_t *)0x0);
      st.st_mtim.tv_sec = tVar5 + -0x3c;
    }
    aVar2 = ares_strcaseeq(paVar6->filename,pcVar4);
    if ((aVar2 != ARES_FALSE) && (st.st_mtim.tv_sec < paVar6->ts)) {
      ares_free(pcVar4);
      return ARES_SUCCESS;
    }
  }
  ares_hosts_file_destroy(channel->hf);
  channel->hf = (ares_hosts_file_t *)0x0;
  buf = ares_buf_create();
  aVar14 = ARES_ENOMEM;
  aVar3 = aVar14;
  if ((buf != (ares_buf_t *)0x0) && (aVar3 = ares_buf_load_file(pcVar4,buf), aVar3 == ARES_SUCCESS))
  {
    paVar6 = (ares_hosts_file_t *)ares_malloc_zero(0x20);
    if (paVar6 != (ares_hosts_file_t *)0x0) {
      tVar5 = time((time_t *)0x0);
      paVar6->ts = tVar5;
      pcVar7 = ares_strdup(pcVar4);
      paVar6->filename = pcVar7;
      if (pcVar7 != (char *)0x0) {
        paVar8 = ares_htable_strvp_create(ares_hosts_entry_destroy_cb);
        paVar6->iphash = paVar8;
        if (paVar8 != (ares_htable_strvp_t *)0x0) {
          paVar8 = ares_htable_strvp_create((ares_htable_strvp_val_free_t)0x0);
          paVar6->hosthash = paVar8;
          if (paVar8 != (ares_htable_strvp_t *)0x0) {
LAB_0011110a:
            local_150 = paVar6;
            paVar6 = local_150;
            sVar9 = ares_buf_len(buf);
            if (sVar9 == 0) goto LAB_001115a8;
            local_15a[0] = '#';
            ares_buf_consume_whitespace(buf,ARES_FALSE);
            sVar9 = ares_buf_len(buf);
            if (sVar9 == 0) goto LAB_001115a8;
            aVar2 = ares_buf_begins_with(buf,local_15a,1);
            if (aVar2 != ARES_FALSE) goto LAB_0011117f;
            ares_buf_tag(buf);
            ares_buf_consume_nonwhitespace(buf);
            aVar3 = ares_buf_tag_fetch_string(buf,(char *)&st,0x2e);
            if (aVar3 != ARES_SUCCESS) {
              if (aVar3 != ARES_ENOMEM) goto LAB_0011117f;
LAB_001115ae:
              entry = (ares_hosts_entry_t *)0x0;
              paVar6 = local_150;
              goto LAB_0011156a;
            }
            aVar2 = ares_normalize_ipaddr((char *)&st,(char *)&st,out_len);
            if (aVar2 == ARES_FALSE) goto LAB_0011117f;
            entry = (ares_hosts_entry_t *)ares_malloc_zero(0x18);
            paVar6 = local_150;
            if (entry == (ares_hosts_entry_t *)0x0) goto LAB_001115c8;
            paVar10 = ares_llist_create(ares_free);
            entry->ips = paVar10;
            if ((paVar10 != (ares_llist_t *)0x0) &&
               (pcVar7 = ares_strdup((char *)&st), pcVar7 != (char *)0x0)) {
              paVar11 = ares_llist_insert_first(entry->ips,pcVar7);
              if (paVar11 == (ares_llist_node_t *)0x0) {
                ares_free(pcVar7);
                goto LAB_001115c3;
              }
              paVar10 = ares_llist_create(ares_free);
              entry->hosts = paVar10;
              if (paVar10 != (ares_llist_t *)0x0) {
LAB_00111226:
                do {
                  sVar9 = ares_buf_len(buf);
                  if (sVar9 == 0) {
LAB_00111335:
                    sVar9 = ares_llist_len(entry->hosts);
                    if (sVar9 != 0) {
                      local_140 = ares_llist_len(entry->hosts);
                      paVar11 = ares_llist_node_first(entry->ips);
                      goto LAB_00111365;
                    }
                    break;
                  }
                  local_15a[1] = 0x23;
                  ares_buf_consume_whitespace(buf,ARES_FALSE);
                  sVar9 = ares_buf_len(buf);
                  if ((sVar9 == 0) ||
                     (aVar2 = ares_buf_begins_with(buf,local_15a + 1,1), aVar2 != ARES_FALSE))
                  goto LAB_00111335;
                  ares_buf_tag(buf);
                  sVar9 = ares_buf_consume_nonwhitespace(buf);
                  if (sVar9 == 0) goto LAB_00111335;
                  aVar3 = ares_buf_tag_fetch_string(buf,(char *)&st,0x100);
                  if (aVar3 == ARES_SUCCESS) {
                    aVar2 = ares_is_hostname((char *)&st);
                    paVar6 = local_150;
                    if (aVar2 != ARES_FALSE) {
                      for (paVar11 = ares_llist_node_first(entry->ips);
                          paVar11 != (ares_llist_node_t *)0x0;
                          paVar11 = ares_llist_node_next(paVar11)) {
                        pcVar7 = (char *)ares_llist_node_val(paVar11);
                        aVar2 = ares_strcaseeq(pcVar7,(char *)&st);
                        paVar6 = local_150;
                        if (aVar2 != ARES_FALSE) goto LAB_00111226;
                      }
                      pcVar7 = ares_strdup((char *)&st);
                      paVar6 = local_150;
                      if (pcVar7 == (char *)0x0) goto LAB_0011156a;
                      paVar11 = ares_llist_insert_last(entry->hosts,pcVar7);
                      paVar6 = local_150;
                      if (paVar11 == (ares_llist_node_t *)0x0) {
                        ares_free(pcVar7);
                        paVar6 = local_150;
                        goto LAB_0011156a;
                      }
                    }
                    goto LAB_00111226;
                  }
                  sVar9 = ares_llist_len(entry->hosts);
                  paVar6 = local_150;
                } while (sVar9 != 0);
                ares_hosts_entry_destroy(entry);
                goto LAB_0011117f;
              }
              goto LAB_0011156a;
            }
            goto LAB_001115c3;
          }
        }
      }
    }
    ares_hosts_file_destroy(paVar6);
    aVar3 = aVar14;
  }
  aVar14 = aVar3;
  entry = (ares_hosts_entry_t *)0x0;
  paVar6 = (ares_hosts_file_t *)0x0;
LAB_0011156a:
  ares_hosts_entry_destroy(entry);
  ares_buf_destroy(buf);
  if (aVar14 == ARES_SUCCESS) {
    channel->hf = paVar6;
  }
  else {
    ares_hosts_file_destroy(paVar6);
  }
  ares_free(pcVar4);
  return aVar14;
LAB_001115a8:
  entry = (ares_hosts_entry_t *)0x0;
  aVar14 = ARES_SUCCESS;
  goto LAB_0011156a;
LAB_00111365:
  if (paVar11 == (ares_llist_node_t *)0x0) goto LAB_00111390;
  pcVar7 = (char *)ares_llist_node_val(paVar11);
  paVar12 = (ares_hosts_entry_t *)ares_htable_strvp_get_direct(paVar6->iphash,pcVar7);
  if (paVar12 != (ares_hosts_entry_t *)0x0) goto LAB_0011146c;
  paVar11 = ares_llist_node_next(paVar11);
  goto LAB_00111365;
LAB_00111390:
  local_148 = paVar11;
  for (paVar11 = ares_llist_node_first(entry->hosts); paVar11 != (ares_llist_node_t *)0x0;
      paVar11 = ares_llist_node_next(paVar11)) {
    pcVar7 = (char *)ares_llist_node_val(paVar11);
    paVar12 = (ares_hosts_entry_t *)ares_htable_strvp_get_direct(paVar6->hosthash,pcVar7);
    if (paVar12 != (ares_hosts_entry_t *)0x0) goto LAB_001113ea;
  }
LAB_00111494:
  local_158 = entry;
  pcVar7 = (char *)ares_llist_last_val(entry->ips);
  aVar2 = ares_htable_strvp_get(paVar6->iphash,pcVar7,(void **)0x0);
  entry = local_158;
  if (aVar2 == ARES_FALSE) {
    aVar2 = ares_htable_strvp_insert(paVar6->iphash,pcVar7,local_158);
    if (aVar2 == ARES_FALSE) {
LAB_001115c3:
      ares_hosts_entry_destroy(entry);
LAB_001115c8:
      entry = (ares_hosts_entry_t *)0x0;
      goto LAB_0011156a;
    }
    entry->refcnt = entry->refcnt + 1;
  }
LAB_001114f0:
  local_158 = entry;
  for (paVar11 = ares_llist_node_last(entry->hosts); paVar11 != (ares_llist_node_t *)0x0;
      paVar11 = ares_llist_node_prev(paVar11)) {
    pcVar7 = (char *)ares_llist_node_val(paVar11);
    bVar15 = local_140 == 0;
    local_140 = local_140 - 1;
    if (bVar15) break;
    aVar2 = ares_htable_strvp_get(local_150->hosthash,pcVar7,(void **)0x0);
    if ((aVar2 == ARES_FALSE) &&
       (aVar2 = ares_htable_strvp_insert(local_150->hosthash,pcVar7,local_158), aVar2 == ARES_FALSE)
       ) goto LAB_001115ae;
  }
LAB_0011117f:
  ares_buf_consume_line(buf,ARES_TRUE);
  paVar6 = local_150;
  goto LAB_0011110a;
LAB_001113ea:
  while (local_158 = paVar12, node = ares_llist_node_first(entry->ips), paVar12 = local_158,
        paVar11 = local_148, node != (ares_llist_node_t *)0x0) {
    pcVar7 = (char *)ares_llist_node_val(node);
    pvVar13 = ares_htable_strvp_get_direct(paVar6->iphash,pcVar7);
    if (pvVar13 == (void *)0x0) {
      ares_llist_node_mvparent_last(node,local_158->ips);
      paVar12 = local_158;
    }
    else {
      ares_llist_node_destroy(node);
      paVar12 = local_158;
    }
  }
LAB_0011146c:
  while (local_148 = paVar11, local_158 = paVar12, paVar11 = ares_llist_node_first(entry->hosts),
        paVar11 != (ares_llist_node_t *)0x0) {
    pcVar7 = (char *)ares_llist_node_val(paVar11);
    pvVar13 = ares_htable_strvp_get_direct(paVar6->hosthash,pcVar7);
    if (pvVar13 == (void *)0x0) {
      ares_llist_node_mvparent_last(paVar11,local_158->hosts);
      paVar12 = local_158;
      paVar11 = local_148;
    }
    else {
      ares_llist_node_destroy(paVar11);
      paVar12 = local_158;
      paVar11 = local_148;
    }
  }
  ares_hosts_entry_destroy(entry);
  entry = local_158;
  if (local_148 != (ares_llist_node_t *)0x0) goto LAB_001114f0;
  goto LAB_00111494;
}

Assistant:

static ares_status_t ares_hosts_update(ares_channel_t *channel,
                                       ares_bool_t     use_env)
{
  ares_status_t status;
  char         *filename = NULL;

  status = ares_hosts_path(channel, use_env, &filename);
  if (status != ARES_SUCCESS) {
    return status;
  }

  if (!ares_hosts_expired(filename, channel->hf)) {
    ares_free(filename);
    return ARES_SUCCESS;
  }

  ares_hosts_file_destroy(channel->hf);
  channel->hf = NULL;

  status = ares_parse_hosts(filename, &channel->hf);
  ares_free(filename);
  return status;
}